

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_4>_> __thiscall
deqp::gls::BuiltinPrecisionTests::exprP<tcu::Vector<float,4>>
          (BuiltinPrecisionTests *this,Expr<tcu::Vector<float,_4>_> *ptr)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<float,_4>_> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_> local_28;
  Expr<tcu::Vector<float,_4>_> *local_18;
  Expr<tcu::Vector<float,_4>_> *ptr_local;
  
  local_18 = ptr;
  ptr_local = (Expr<tcu::Vector<float,_4>_> *)this;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>::SharedPtr
            (&local_28,ptr);
  exprP<tcu::Vector<float,4>>(this,&local_28);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>::~SharedPtr
            (&local_28);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.super_ExprPBase<tcu::Vector<float,_4>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.super_ExprPBase<tcu::Vector<float,_4>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_4>_> *)this;
  return (ExprP<tcu::Vector<float,_4>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
         super_ExprPBase<tcu::Vector<float,_4>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>;
}

Assistant:

ExprP<T> exprP (const Expr<T>* ptr)
{
	return exprP(SharedPtr<const Expr<T> >(ptr));
}